

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O1

int __thiscall Gnuplot::init(Gnuplot *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  long *plVar2;
  FILE *pFVar3;
  size_type *psVar5;
  size_type *local_60;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Gnuplot *pGVar4;
  
  tmp.field_2._8_8_ = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(tmp.field_2._M_local_buf + 8),m_sGNUPlotPath_abi_cxx11_._M_dataplus._M_p,
             m_sGNUPlotPath_abi_cxx11_._M_dataplus._M_p + m_sGNUPlotPath_abi_cxx11_._M_string_length
            );
  std::__cxx11::string::append(tmp.field_2._M_local_buf + 8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (tmp.field_2._M_local_buf + 8,
                              (ulong)m_sGNUPlotFileName_abi_cxx11_._M_dataplus._M_p);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    tmp._M_string_length = *psVar5;
    tmp.field_2._M_allocated_capacity = plVar2[3];
    local_60 = &tmp._M_string_length;
  }
  else {
    tmp._M_string_length = *psVar5;
    local_60 = (size_type *)*plVar2;
  }
  tmp._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((size_type *)tmp.field_2._8_8_ != &__str._M_string_length) {
    operator_delete((void *)tmp.field_2._8_8_,__str._M_string_length + 1);
  }
  pFVar3 = popen((char *)local_60,"w");
  this->gnucmd = (FILE *)pFVar3;
  this->nplots = 0;
  this->valid = true;
  std::__cxx11::string::_M_replace
            ((ulong)&this->smooth,0,(char *)(this->smooth)._M_string_length,0x145f21);
  pGVar4 = showonscreen(this);
  iVar1 = (int)pGVar4;
  if (local_60 != &tmp._M_string_length) {
    operator_delete(local_60,tmp._M_string_length + 1);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void Gnuplot::init() {
  // char * getenv ( const char * name );  get value of environment variable
  // Retrieves a C string containing the value of the environment variable
  // whose name is specified as argument.  If the requested variable is not
  // part of the environment list, the function returns a NULL pointer.
#if ( defined(unix) || defined(__unix) || defined(__unix__) ) && !defined(__APPLE__)
//    if (getenv("DISPLAY") == NULL)
//    {
//        valid = false;
//        throw GnuplotException("Can't find DISPLAY variable");
//    }
#endif

  // if gnuplot not available
//  if (!Gnuplot::get_program_path()) {
//    valid = false;
//     throw GnuplotException("Can't find gnuplot");
//  }

  //
  // open pipe
  //
  std::string tmp = Gnuplot::m_sGNUPlotPath + "/" +
                        Gnuplot::m_sGNUPlotFileName;

  // FILE *popen(const char *command, const char *mode);
  // The popen() function shall execute the command specified by the string
  // command, create a pipe between the calling program and the executed
  // command, and return a pointer to a stream that can be used to either read
  // from or write to the pipe.
#if defined(WIN32) || defined(_WIN32) || defined(__WIN32__) || defined(__TOS_WIN__)
  gnucmd = _popen(tmp.c_str(), "w");
#elif defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
  gnucmd = popen(tmp.c_str(), "w");
#endif

  // popen() shall return a pointer to an open stream that can be used to read
  // or write to the pipe.  Otherwise, it shall return a null pointer and may
  // set errno to indicate the error.
  if (!gnucmd) {
//    valid = false;
//    throw GnuplotException("Couldn't open connection to gnuplot");
  }

  nplots = 0;
  valid = true;
  smooth = "";

  // set terminal type
  showonscreen();

  return;
}